

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O2

long cfgfile::format_t<long,_cfgfile::qstring_trait_t>::from_string
               (parser_info_t<cfgfile::qstring_trait_t> *info,string_t *value)

{
  long lVar1;
  exception_t<cfgfile::qstring_trait_t> *this;
  bool ok;
  allocator<char> local_1ac;
  allocator<char> local_1ab;
  allocator<char> local_1aa;
  allocator<char> local_1a9;
  string local_1a8;
  string_t local_188;
  string_t local_170;
  string_t local_158;
  string_t local_140;
  string_t local_128;
  qstring_wrapper_t local_110;
  qstring_wrapper_t local_f8;
  qstring_wrapper_t local_e0;
  qstring_wrapper_t local_c8;
  qstring_wrapper_t local_b0;
  qstring_wrapper_t local_98;
  string local_80;
  string local_60;
  string local_40;
  
  ok = false;
  local_1a8._M_dataplus._M_p = (pointer)(value->m_str).d.d;
  local_1a8._M_string_length = (size_type)(value->m_str).d.ptr;
  local_1a8.field_2._M_allocated_capacity = (value->m_str).d.size;
  if ((Data *)local_1a8._M_dataplus._M_p != (Data *)0x0) {
    LOCK();
    (((Data *)local_1a8._M_dataplus._M_p)->super_QArrayData).ref_._q_value.super___atomic_base<int>
         = (__atomic_base<int>)
           ((__int_type)
            (((Data *)local_1a8._M_dataplus._M_p)->super_QArrayData).ref_._q_value.
            super___atomic_base<int> + 1);
    UNLOCK();
  }
  lVar1 = QString::toLong((QString *)&local_1a8,&ok,10);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_1a8);
  if (ok != false) {
    return lVar1;
  }
  this = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"Invalid value: \"",&local_1a9);
  qstring_trait_t::from_ascii(&local_128,&local_1a8);
  operator+(&local_110,&local_128,value);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"\". In file \"",&local_1aa);
  qstring_trait_t::from_ascii(&local_140,&local_40);
  operator+(&local_f8,&local_110,&local_140);
  operator+(&local_e0,&local_f8,&info->m_file_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"\" on line ",&local_1ab);
  qstring_trait_t::from_ascii(&local_158,&local_60);
  operator+(&local_c8,&local_e0,&local_158);
  qstring_trait_t::to_string(&local_170,info->m_line_number);
  operator+(&local_b0,&local_c8,&local_170);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,".",&local_1ac);
  qstring_trait_t::from_ascii(&local_188,&local_80);
  operator+(&local_98,&local_b0,&local_188);
  exception_t<cfgfile::qstring_trait_t>::exception_t(this,&local_98);
  __cxa_throw(this,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

static long from_string( const parser_info_t< qstring_trait_t > & info,
		const qstring_trait_t::string_t & value )
	{
		bool ok = false;
		long result = ((QString)value).toLong( &ok );

		if( !ok )
			throw exception_t< qstring_trait_t >(
				qstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + qstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				qstring_trait_t::from_ascii( "\" on line " ) +
				qstring_trait_t::to_string( info.line_number() ) +
				qstring_trait_t::from_ascii( "." ) );
		else
			return result;
	}